

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O3

void GA_Set_irreg_distr(int g_a,int *map,int *block)

{
  Integer IVar1;
  Integer *mapc;
  int *piVar2;
  long lVar3;
  Integer _ga_work [7];
  Integer aIStack_58 [8];
  
  IVar1 = pnga_get_dimension((long)g_a);
  piVar2 = block;
  lVar3 = IVar1;
  if (0 < IVar1) {
    do {
      aIStack_58[lVar3 + -1] = (long)*piVar2;
      lVar3 = lVar3 + -1;
      piVar2 = piVar2 + 1;
    } while (lVar3 != 0);
  }
  mapc = copy_map(block,(int)IVar1,map);
  pnga_set_irreg_distr((long)g_a,mapc,aIStack_58);
  free(mapc);
  return;
}

Assistant:

void GA_Set_irreg_distr(int g_a, int map[], int block[])
{
    Integer aa, ndim;
    Integer _ga_work[MAXDIM];
    Integer *_ga_map_capi;

    aa = (Integer)g_a;
    ndim = wnga_get_dimension(aa);
    COPYC2F(block,_ga_work, ndim);
    _ga_map_capi = copy_map(block, (int)ndim, map);

    wnga_set_irreg_distr(aa, _ga_map_capi, _ga_work);
    free(_ga_map_capi);
}